

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_create.cpp
# Opt level: O2

void __thiscall
duckdb::LogicalCreate::LogicalCreate
          (LogicalCreate *this,LogicalOperatorType type,ClientContext *context,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *info_p)

{
  pointer pCVar1;
  pointer pCVar2;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> oVar3;
  
  LogicalOperator::LogicalOperator(&this->super_LogicalOperator,type);
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)&PTR__LogicalCreate_0178b290;
  (this->schema).ptr = (SchemaCatalogEntry *)0x0;
  (this->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (info_p->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
       .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
       super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
  (info_p->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
  pCVar1 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&this->info);
  pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (&this->info);
  oVar3 = Catalog::GetSchema(context,&pCVar1->catalog,&pCVar2->schema,RETURN_NULL);
  (this->schema).ptr = oVar3.ptr;
  return;
}

Assistant:

LogicalCreate::LogicalCreate(LogicalOperatorType type, ClientContext &context, unique_ptr<CreateInfo> info_p)
    : LogicalOperator(type), info(std::move(info_p)) {
	this->schema = Catalog::GetSchema(context, info->catalog, info->schema, OnEntryNotFound::RETURN_NULL);
}